

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_completion_hash_mismatch::test_method
          (chainstatemanager_snapshot_completion_hash_mismatch *this)

{
  __tuple_element_t<0UL,_tuple<Chainstate_*,_Chainstate_*>_> pCVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  __tuple_element_t<0UL,_tuple<Chainstate_*,_Chainstate_*>_> *ppCVar5;
  type pCVar6;
  pointer pKVar7;
  reference ppCVar8;
  TestChain100Setup *this_00;
  AnnotatedMixin<std::recursive_mutex> *this_01;
  long in_FS_OFFSET;
  ChainstateManager *chainman_restarted;
  CCoinsViewCache *ibd_coins;
  ChainstateManager *chainman;
  Chainstate *validation_chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  SnapshotCompletionResult res;
  tuple<Chainstate_*,_Chainstate_*> chainstates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  path snapshot_invalid_dir;
  DebugLogHelper debugloghelper60;
  path snapshot_chainstate_dir;
  Txid txid;
  Coin badcoin;
  char *in_stack_fffffffffffff548;
  __native_type *in_stack_fffffffffffff550;
  char *in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  int in_stack_fffffffffffff564;
  undefined4 in_stack_fffffffffffff568;
  undefined1 fTry;
  int in_stack_fffffffffffff56c;
  undefined4 in_stack_fffffffffffff570;
  uint in_stack_fffffffffffff574;
  lazy_ostream *in_stack_fffffffffffff578;
  const_string *in_stack_fffffffffffff580;
  ChainTestingSetup *pCVar9;
  allocator<char> *in_stack_fffffffffffff588;
  int num_blocks;
  char *in_stack_fffffffffffff590;
  ChainstateManager *in_stack_fffffffffffff598;
  COutPoint *in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  SnapshotTestSetup *in_stack_fffffffffffff648;
  undefined1 local_850 [168];
  undefined1 local_7a8 [88];
  const_string local_750 [2];
  lazy_ostream local_730 [2];
  assertion_result local_710 [2];
  const_string local_6d8 [2];
  lazy_ostream local_6b8 [2];
  assertion_result local_698 [2];
  __native_type local_65c;
  undefined1 local_628 [64];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [2];
  assertion_result local_5a8 [2];
  const_string local_570 [2];
  lazy_ostream local_550 [2];
  assertion_result local_530 [5];
  const_string local_4a8 [2];
  lazy_ostream local_488 [2];
  assertion_result local_468 [2];
  undefined1 local_430 [96];
  undefined1 local_3d0 [92];
  __native_type local_374 [3];
  __native_type local_2fc [2];
  type local_2a8;
  allocator<char> local_271;
  const_string local_270 [2];
  lazy_ostream local_250 [2];
  assertion_result local_230 [2];
  undefined1 local_1f1;
  __tuple_element_t<0UL,_tuple<Chainstate_*,_Chainstate_*>_> local_1f0;
  SnapshotCompletionResult local_1e4;
  undefined8 local_38;
  undefined4 local_10;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)&stack0xfffffffffffffe20);
  ppCVar5 = std::get<0ul,Chainstate*,Chainstate*>
                      ((tuple<Chainstate_*,_Chainstate_*> *)in_stack_fffffffffffff548);
  pCVar1 = *ppCVar5;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff588,(char *)in_stack_fffffffffffff580,
             (int)((ulong)in_stack_fffffffffffff578 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (char *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
  pCVar6 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffff558);
  pKVar7 = std::
           unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>::
           operator->((unique_ptr<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
                       *)in_stack_fffffffffffff548);
  pKVar7->m_shutdown_on_fatal_error = false;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff548);
  local_1f0 = pCVar1;
  test_method::anon_class_8_1_02cb0316::operator()
            ((anon_class_8_1_02cb0316 *)
             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
  Coin::Coin((Coin *)in_stack_fffffffffffff548);
  uVar3 = RandomMixin<FastRandomContext>::rand32
                    ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff548);
  local_38 = ZEXT48(uVar3);
  local_10 = local_10 & 1 | 2;
  RandomMixin<FastRandomContext>::randbits
            ((RandomMixin<FastRandomContext> *)
             CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568),in_stack_fffffffffffff564
            );
  local_1f1 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff558,
             (size_type)((ulong)in_stack_fffffffffffff550 >> 0x20),
             (uchar *)in_stack_fffffffffffff548);
  RandomMixin<FastRandomContext>::rand256
            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff578);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffff548);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_fffffffffffff558,(Txid *)&in_stack_fffffffffffff550->__data,
             (uint32_t)((ulong)in_stack_fffffffffffff548 >> 0x20));
  CCoinsViewCache::AddCoin
            ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             in_stack_fffffffffffff5a0,(Coin *)in_stack_fffffffffffff598,
             SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
  ArgsManager::GetDataDirNet((ArgsManager *)&in_stack_fffffffffffff550->__data);
  fs::operator/((path *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                in_stack_fffffffffffff558);
  fs::path::~path((path *)in_stack_fffffffffffff548);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    fs::exists((path *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_230,local_250,local_270,0x2d8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  std::function<bool(std::__cxx11::string_const*)>::
  function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
            ((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)in_stack_fffffffffffff558,
             (anon_class_1_0_00000001 *)&in_stack_fffffffffffff550->__data);
  DebugLogHelper::DebugLogHelper
            ((DebugLogHelper *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             (string *)in_stack_fffffffffffff5a0,(MatchFn *)in_stack_fffffffffffff598);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
               *)in_stack_fffffffffffff548);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff548);
  std::allocator<char>::~allocator(&local_271);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff548);
  local_2a8 = pCVar6;
  local_1e4 = test_method::anon_class_8_1_3d09f077::operator()
                        ((anon_class_8_1_3d09f077 *)
                         CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    local_2fc[0].__data.__lock = 4;
    in_stack_fffffffffffff558 = "SnapshotCompletionResult::HASH_MISMATCH";
    in_stack_fffffffffffff550 = local_2fc;
    in_stack_fffffffffffff548 = "res";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,SnapshotCompletionResult,SnapshotCompletionResult>
              (&local_2fc[0].__data.__spins,&local_2fc[0].__data.__count,0x2dd,1,2,&local_1e4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)in_stack_fffffffffffff548);
  ChainstateManager::GetAll(in_stack_fffffffffffff598);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    local_374[0]._4_8_ =
         std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                   ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff548
                   );
    local_374[0].__data.__lock = 1;
    in_stack_fffffffffffff558 = "1";
    in_stack_fffffffffffff550 = local_374;
    in_stack_fffffffffffff548 = "all_chainstates.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              ((undefined1 *)((long)&local_374[0].__data.__list.__prev + 4),
               &local_374[0].__data.__nusers,0x2e1,1,2,&local_374[0].__data.__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    ppCVar8 = std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::operator[]
                        ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                         in_stack_fffffffffffff558,(size_type)in_stack_fffffffffffff550);
    in_stack_fffffffffffff558 = "&validation_chainstate";
    in_stack_fffffffffffff550 = (__native_type *)local_3d0;
    in_stack_fffffffffffff548 = "all_chainstates[0]";
    local_3d0._0_8_ = pCVar1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
              (&(((__native_type *)local_3d0)->__data).__list,
               &(((__native_type *)local_3d0)->__data).__owner,0x2e2,1,2,ppCVar8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    local_430._8_8_ =
         ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff558);
    in_stack_fffffffffffff558 = "&validation_chainstate";
    in_stack_fffffffffffff550 = (__native_type *)local_430;
    in_stack_fffffffffffff548 = "&chainman.ActiveChainstate()";
    local_430._0_8_ = pCVar1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
              ((__pthread_internal_list **)
               ((long)&(((__native_type *)local_430)->__data).__list + 8),
               &(((__native_type *)local_430)->__data).__kind,0x2e3,1,2,
               &(((__native_type *)local_430)->__data).__owner);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  ArgsManager::GetDataDirNet((ArgsManager *)&in_stack_fffffffffffff550->__data);
  fs::operator/((path *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                in_stack_fffffffffffff558);
  fs::path::~path((path *)in_stack_fffffffffffff548);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    fs::exists((path *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_468,local_488,local_4a8,0x2e6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  SnapshotTestSetup::SimulateNodeRestart(in_stack_fffffffffffff648);
  pCVar9 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
             in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
  boost::unit_test::log::begin::begin
            ((begin *)in_stack_fffffffffffff558,(const_string *)&in_stack_fffffffffffff550->__data,
             (size_t)in_stack_fffffffffffff548);
  boost::unit_test::unit_test_log_t::operator<<
            ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
             (begin *)in_stack_fffffffffffff5a0);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (log_level)((ulong)in_stack_fffffffffffff558 >> 0x20));
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
             (char (*) [46])in_stack_fffffffffffff548);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff558,
             (lazy_ostream *)&in_stack_fffffffffffff550->__data);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[46],_const_char_(&)[46]> *)
             in_stack_fffffffffffff548);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)0xcd9c28);
  ChainTestingSetup::LoadVerifyActivateChainstate(pCVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    fs::exists((path *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_530,local_550,local_570,0x2f3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    fs::exists((path *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5a8,local_5c8,local_5e8,0x2f4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff548);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff588,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff580,
             (char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             in_stack_fffffffffffff56c,SUB41((uint)in_stack_fffffffffffff568 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    ChainstateManager::GetAll(in_stack_fffffffffffff598);
    local_65c._28_8_ =
         std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::size
                   ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff548
                   );
    local_65c.__data.__lock = 1;
    in_stack_fffffffffffff558 = "1";
    in_stack_fffffffffffff550 = &local_65c;
    in_stack_fffffffffffff548 = "chainman_restarted.GetAll().size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_628,(undefined1 *)((long)&local_65c.__data.__list.__next + 4),0x2f8,1,2,
               (undefined1 *)((long)&local_65c.__data.__list.__prev + 4));
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff558);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    ChainstateManager::IsSnapshotActive
              ((ChainstateManager *)CONCAT44(in_stack_fffffffffffff56c,in_stack_fffffffffffff568));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_698,local_6b8,local_6d8,0x2f9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    ChainstateManager::IsSnapshotValidated((ChainstateManager *)in_stack_fffffffffffff558);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff558,
               SUB81((ulong)in_stack_fffffffffffff550 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff548 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_710,local_730,local_750,0x2fa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff548);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
               (size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    uVar4 = ChainstateManager::ActiveHeight((ChainstateManager *)in_stack_fffffffffffff548);
    local_7a8._0_4_ = 0xd2;
    in_stack_fffffffffffff558 = "210";
    in_stack_fffffffffffff550 = (__native_type *)local_7a8;
    in_stack_fffffffffffff548 = "chainman_restarted.ActiveHeight()";
    local_7a8._4_4_ = uVar4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&(((__native_type *)local_7a8)->__data).__list,
               &(((__native_type *)local_7a8)->__data).__owner,0x2fb,1,2,
               &(((__native_type *)local_7a8)->__data).__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    fTry = (undefined1)((uint)in_stack_fffffffffffff568 >> 0x18);
    in_stack_fffffffffffff5a8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff5a8);
  } while (bVar2);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff548);
  num_blocks = (int)((ulong)in_stack_fffffffffffff588 >> 0x20);
  pCVar9 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
             in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
  boost::unit_test::log::begin::begin
            ((begin *)in_stack_fffffffffffff558,(const_string *)&in_stack_fffffffffffff550->__data,
             (size_t)in_stack_fffffffffffff548);
  boost::unit_test::unit_test_log_t::operator<<
            ((unit_test_log_t *)CONCAT44(uVar4,in_stack_fffffffffffff5a8),(begin *)pCVar9);
  boost::unit_test::unit_test_log_t::operator()
            ((unit_test_log_t *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (log_level)((ulong)in_stack_fffffffffffff558 >> 0x20));
  this_00 = (TestChain100Setup *)boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
             (char (*) [61])in_stack_fffffffffffff548);
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)in_stack_fffffffffffff558,
             (lazy_ostream *)&in_stack_fffffffffffff550->__data);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[61],_const_char_(&)[61]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[61],_const_char_(&)[61]> *)
             in_stack_fffffffffffff548);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)0xcda59c);
  TestChain100Setup::mineBlocks(this_00,num_blocks);
  this_01 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                      ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff548);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_01,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff580,
             (char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             in_stack_fffffffffffff56c,(bool)fTry);
  do {
    pCVar9 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff548);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,(const_string *)pCVar9,(size_t)in_stack_fffffffffffff578,
               (const_string *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    in_stack_fffffffffffff578 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff550->__data,
               (char (*) [1])in_stack_fffffffffffff548);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff558,
               in_stack_fffffffffffff550->__size,(unsigned_long)in_stack_fffffffffffff548);
    in_stack_fffffffffffff574 =
         ChainstateManager::ActiveHeight((ChainstateManager *)in_stack_fffffffffffff548);
    local_850._0_4_ = 0xdc;
    in_stack_fffffffffffff558 = "220";
    in_stack_fffffffffffff550 = (__native_type *)local_850;
    in_stack_fffffffffffff548 = "chainman_restarted.ActiveHeight()";
    local_850._4_4_ = in_stack_fffffffffffff574;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&(((__native_type *)local_850)->__data).__list,
               &(((__native_type *)local_850)->__data).__owner,0x303,1,2,
               &(((__native_type *)local_850)->__data).__count);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff548);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff570 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff570);
  } while (bVar2);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff548);
  fs::path::~path((path *)in_stack_fffffffffffff548);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff558);
  fs::path::~path((path *)in_stack_fffffffffffff548);
  Coin::~Coin((Coin *)in_stack_fffffffffffff548);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_completion_hash_mismatch, SnapshotTestSetup)
{
    auto chainstates = this->SetupSnapshot();
    Chainstate& validation_chainstate = *std::get<0>(chainstates);
    ChainstateManager& chainman = *Assert(m_node.chainman);
    SnapshotCompletionResult res;
    m_node.notifications->m_shutdown_on_fatal_error = false;

    // Test tampering with the IBD UTXO set with an extra coin to ensure it causes
    // snapshot completion to fail.
    CCoinsViewCache& ibd_coins = WITH_LOCK(::cs_main,
        return validation_chainstate.CoinsTip());
    Coin badcoin;
    badcoin.out.nValue = m_rng.rand32();
    badcoin.nHeight = 1;
    badcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
    Txid txid = Txid::FromUint256(m_rng.rand256());
    ibd_coins.AddCoin(COutPoint(txid, 0), std::move(badcoin), false);

    fs::path snapshot_chainstate_dir = gArgs.GetDataDirNet() / "chainstate_snapshot";
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));

    {
        ASSERT_DEBUG_LOG("failed to validate the -assumeutxo snapshot state");
        res = WITH_LOCK(::cs_main, return chainman.MaybeCompleteSnapshotValidation());
        BOOST_CHECK_EQUAL(res, SnapshotCompletionResult::HASH_MISMATCH);
    }

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 1);
    BOOST_CHECK_EQUAL(all_chainstates[0], &validation_chainstate);
    BOOST_CHECK_EQUAL(&chainman.ActiveChainstate(), &validation_chainstate);

    fs::path snapshot_invalid_dir = gArgs.GetDataDirNet() / "chainstate_snapshot_INVALID";
    BOOST_CHECK(fs::exists(snapshot_invalid_dir));

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully loads only the fully-validated
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates, and should clean up the now unnecessary
    // background-validation leveldb contents.
    this->LoadVerifyActivateChainstate();

    BOOST_CHECK(fs::exists(snapshot_invalid_dir));
    BOOST_CHECK(!fs::exists(snapshot_chainstate_dir));

    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 1);
        BOOST_CHECK(!chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the \"new\" IBD chainstate");
    mineBlocks(10);
    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);
    }
}